

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_tuple_uncheckedSlotAt(sysbvm_context_t *context,sysbvm_tuple_t tuple,size_t slotIndex)

{
  ulong uVar1;
  bool bVar2;
  
  bVar2 = (tuple & 0xf) != 0;
  if (bVar2 || tuple == 0) {
    uVar1 = 0;
    sysbvm_error_modifyImmediateValue();
  }
  else {
    if ((*(uint *)(tuple + 8) & 0x300) == 0x200) {
      sysbvm_error("uncheckedSlotAt used with byte tuple.");
    }
    if (bVar2 || tuple == 0) {
      uVar1 = 0;
    }
    else {
      uVar1 = (ulong)(*(uint *)(tuple + 0xc) >> 3);
    }
  }
  if (uVar1 <= slotIndex) {
    sysbvm_error_outOfBoundsSlotAccess();
  }
  return *(sysbvm_tuple_t *)(tuple + 0x10 + slotIndex * 8);
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_tuple_uncheckedSlotAt(sysbvm_context_t *context, sysbvm_tuple_t tuple, size_t slotIndex)
{
    (void)context;
    if(!sysbvm_tuple_isNonNullPointer(tuple)) sysbvm_error_modifyImmediateValue();
    if(sysbvm_tuple_isBytes(tuple)) sysbvm_error("uncheckedSlotAt used with byte tuple.");
    if(slotIndex >= sysbvm_tuple_getSizeInSlots(tuple)) sysbvm_error_outOfBoundsSlotAccess();
    
    return SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(tuple)->pointers[slotIndex];
}